

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wchar.cpp
# Opt level: O0

int PAL_wcsncmp(char16_t *string1,char16_t *string2,size_t count)

{
  int local_34;
  ulong uStack_30;
  int diff;
  size_t i;
  size_t count_local;
  char16_t *string2_local;
  char16_t *string1_local;
  
  local_34 = 0;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if (string1 == string2) {
    string1_local._4_4_ = 0;
  }
  else {
    for (uStack_30 = 0;
        ((uStack_30 < count &&
         (local_34 = (uint)(ushort)string1[uStack_30] - (uint)(ushort)string2[uStack_30],
         local_34 == 0)) && (string1[uStack_30] != L'\0')); uStack_30 = uStack_30 + 1) {
    }
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
    string1_local._4_4_ = local_34;
  }
  return string1_local._4_4_;
}

Assistant:

int
__cdecl
PAL_wcsncmp(
        const char16_t *string1,
        const char16_t *string2,
        size_t count)
{
    size_t i;
    int diff = 0;

    PERF_ENTRY(wcsncmp);
    ENTRY("wcsncmp (string1=%p (%S), string2=%p (%S) count=%lu)\n",
          string1?string1:W16_NULLSTRING,
          string1?string1:W16_NULLSTRING, string2?string2:W16_NULLSTRING, string2?string2:W16_NULLSTRING,
          (unsigned long) count);

    if (string1 == string2) return diff;

    for (i = 0; i < count; i++)
    {
        diff = string1[i] - string2[i];
        if (diff != 0)
        {
            break;
        }

        /* stop if we reach the end of the string */
        if(string1[i]==0)
        {
            break;
        }
    }
    LOGEXIT("wcsncmp returning int %d\n", diff);
    PERF_EXIT(wcsncmp);
    return diff;
}